

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void __thiscall
QCborContainerPrivate::replaceAt_complex
          (QCborContainerPrivate *this,Element *e,QCborValue *value,ContainerDisposition disp)

{
  Element *pEVar1;
  uint uVar2;
  void *__arg;
  Type TVar3;
  ValueFlags VVar4;
  int iVar5;
  ByteData *this_00;
  qptrdiff qVar6;
  undefined4 extraout_var;
  char *block;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  long local_38;
  QCborContainerPrivate *pQVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __arg = (void *)value->n;
  pQVar7 = value->container;
  if ((long)__arg < 0) {
    if (pQVar7 == this) {
      if (disp == MoveContainer) {
        LOCK();
        (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
             _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
      }
      iVar5 = clone((__fn *)this,(void *)0xffffffffffffffff,(int)value,__arg);
      pQVar7 = (QCborContainerPrivate *)CONCAT44(extraout_var,iVar5);
      QList<QtCbor::Element>::detach(&pQVar7->elements);
      (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> = (__atomic_base<int>)0x1;
      (e->field_0).container = pQVar7;
    }
    else {
      (e->field_0).container = pQVar7;
      if (disp == CopyContainer) {
        LOCK();
        (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar7->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    e->type = value->t;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 1;
  }
  else {
    pEVar1 = (pQVar7->elements).d.ptr + (long)__arg;
    TVar3 = pEVar1->type;
    VVar4.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (pEVar1->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
    e->field_0 = pEVar1->field_0;
    e->type = TVar3;
    e->flags = (ValueFlags)
               VVar4.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
               super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    this_00 = byteData(value->container,value->n);
    if (this_00 != (ByteData *)0x0) {
      uVar2 = (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
              super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar2 & 0xfffffffd;
      if (value->container == this) {
        local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QtCbor::ByteData::toByteArray((QByteArray *)&local_58,this_00);
        compact(this);
        block = local_58.ptr;
        if (local_58.ptr == (char *)0x0) {
          block = &QByteArray::_empty;
        }
        qVar6 = addByteData(this,block,local_58.size);
        (e->field_0).value = qVar6;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
      }
      else {
        compact(this);
        qVar6 = addByteData(this,(char *)(this_00 + 1),this_00->len);
        (e->field_0).value = qVar6;
      }
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar2;
    }
    if (disp == MoveContainer) {
      deref(value->container);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCborContainerPrivate::replaceAt_complex(Element &e, const QCborValue &value, ContainerDisposition disp)
{
    if (value.n < 0) {
        // This QCborValue is an array, map, or tagged value (container points
        // to itself).

        // detect self-assignment
        if (Q_UNLIKELY(this == value.container)) {
            Q_ASSERT(ref.loadRelaxed() >= 2);
            if (disp == MoveContainer)
                ref.deref();    // not deref() because it can't drop to 0
            QCborContainerPrivate *d = QCborContainerPrivate::clone(this);
            d->elements.detach();
            d->ref.storeRelaxed(1);
            e.container = d;
        } else {
            e.container = value.container;
            if (disp == CopyContainer)
                e.container->ref.ref();
        }

        e.type = value.type();
        e.flags = Element::IsContainer;
    } else {
        // String data, copy contents
        e = value.container->elements.at(value.n);

        // Copy string data, if any
        if (const ByteData *b = value.container->byteData(value.n)) {
            const auto flags = e.flags;
            // The element e has an invalid e.value, because it is copied from
            // value. It means that calling compact() will trigger an assertion
            // or just silently corrupt the data.
            // Temporarily unset the Element::HasByteData flag in order to skip
            // the element e in the call to compact().
            e.flags = e.flags & ~Element::HasByteData;
            if (this == value.container) {
                const QByteArray valueData = b->toByteArray();
                compact();
                e.value = addByteData(valueData, valueData.size());
            } else {
                compact();
                e.value = addByteData(b->byte(), b->len);
            }
            // restore the flags
            e.flags = flags;
        }

        if (disp == MoveContainer)
            value.container->deref();
    }
}